

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_handle.cpp
# Opt level: O1

void __thiscall
libtorrent::torrent_handle::
async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<char,std::allocator<char>>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::add_piece_flags_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,std::vector<char,std::allocator<char>>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::add_piece_flags_tag,void>const&>
          (torrent_handle *this,offset_in_torrent_to_subr f,
          bitfield_flag<unsigned_int,_libtorrent::status_flags_tag,_void> *a,
          vector<char,_std::allocator<char>_> *a_1,
          bitfield_flag<unsigned_char,_libtorrent::add_piece_flags_tag,_void> *a_2)

{
  int iVar1;
  io_context *piVar2;
  int iVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined1 *in_R9;
  bool bVar4;
  undefined1 local_78 [40];
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_50;
  vector<char,_std::allocator<char>_> local_48;
  undefined1 local_30;
  io_context *local_28;
  undefined4 local_1c;
  
  this_00 = (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = this_00->_M_use_count;
    do {
      if (iVar3 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = iVar3 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = iVar3 + 1;
        iVar1 = iVar3;
      }
      iVar3 = iVar1;
      UNLOCK();
    } while (!bVar4);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = this_00->_M_use_count == 0;
  }
  if ((!bVar4) &&
     (local_78._8_8_ =
           (this->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr, (element_type *)local_78._8_8_ != (element_type *)0x0)) {
    local_78._0_8_ = (((element_type *)local_78._8_8_)->super_torrent_hot_members).m_ses;
    piVar2 = ((session_impl *)local_78._0_8_)->m_io_context;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_50.m_val =
         *(int *)&(a_1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    local_78._16_8_ = this_00;
    local_78._24_8_ = f;
    local_78._32_8_ = a;
    ::std::vector<char,_std::allocator<char>_>::vector
              (&local_48,(vector<char,_std::allocator<char>_> *)a_2);
    local_30 = *in_R9;
    local_1c = 0;
    local_28 = piVar2;
    boost::asio::io_context::basic_executor_type<std::allocator<void>,0u>::
    execute<libtorrent::torrent_handle::async_call<void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<char,std::allocator<char>>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::add_piece_flags_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,std::vector<char,std::allocator<char>>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::add_piece_flags_tag,void>const&>(void(libtorrent::aux::torrent::*)(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>,std::vector<char,std::allocator<char>>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::add_piece_flags_tag,void>),libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>&,std::vector<char,std::allocator<char>>&&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::add_piece_flags_tag,void>const&)const::_lambda()_1_>
              ((basic_executor_type<std::allocator<void>,0u> *)&local_28,(type_conflict1 *)local_78)
    ;
    if (local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._16_8_);
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    return;
  }
  local_78._0_4_ = 0x14;
  aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
            ((error_code_enum *)local_78);
}

Assistant:

void torrent_handle::async_call(Fun f, Args&&... a) const
	{
		auto t = m_torrent.lock();
		if (!t) aux::throw_ex<system_error>(errors::invalid_torrent_handle);
		auto& ses = static_cast<session_impl&>(t->session());
		dispatch(ses.get_context(), [=,&ses] ()
		{
#ifndef BOOST_NO_EXCEPTIONS
			try {
#endif
				(t.get()->*f)(std::move(a)...);
#ifndef BOOST_NO_EXCEPTIONS
			} catch (system_error const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, e.code(), e.what());
			} catch (std::exception const& e) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), e.what());
			} catch (...) {
				ses.alerts().emplace_alert<torrent_error_alert>(torrent_handle(t)
					, error_code(), "unknown error");
			}
#endif
		} );
	}